

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_EnumValueAliasError_Test::
~ParserValidationErrorTest_EnumValueAliasError_Test
          (ParserValidationErrorTest_EnumValueAliasError_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParserValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserTest_018d8b70;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParserValidationErrorTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParserValidationErrorTest).input_);
  pZVar1 = (this->super_ParserValidationErrorTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParserValidationErrorTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParserValidationErrorTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParserValidationErrorTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, EnumValueAliasError) {
  ExpectHasValidationErrors(
      "enum Foo {\n"
      "  BAR = 1;\n"
      "  BAZ = 1;\n"
      "}\n",
      "2:8: \"BAZ\" uses the same enum value as \"BAR\". If this is "
      "intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 2.\n");
}